

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_ENCHANT(effect_handler_context_t_conflict *context)

{
  _Bool _Var1;
  wchar_t num_dam;
  _Bool local_15;
  _Bool used;
  wchar_t value;
  effect_handler_context_t_conflict *context_local;
  
  num_dam = randcalc((random_value)context->value,(int)player->depth,RANDOMISE);
  local_15 = false;
  context->ident = true;
  if ((context->subtype & 3U) == 3) {
    local_15 = enchant_spell(num_dam,num_dam,L'\0',context->cmd);
  }
  else if ((context->subtype & 1U) == 0) {
    if ((context->subtype & 2U) != 0) {
      local_15 = enchant_spell(L'\0',num_dam,L'\0',context->cmd);
    }
  }
  else {
    local_15 = enchant_spell(num_dam,L'\0',L'\0',context->cmd);
  }
  if (((context->subtype & 4U) != 0) &&
     (_Var1 = enchant_spell(L'\0',L'\0',num_dam,context->cmd), _Var1)) {
    local_15 = true;
  }
  return local_15;
}

Assistant:

bool effect_handler_ENCHANT(effect_handler_context_t *context)
{
	int value = randcalc(context->value, player->depth, RANDOMISE);
	bool used = false;
	context->ident = true;

	if ((context->subtype & ENCH_TOBOTH) == ENCH_TOBOTH) {
		if (enchant_spell(value, value, 0, context->cmd))
			used = true;
	}
	else if (context->subtype & ENCH_TOHIT) {
		if (enchant_spell(value, 0, 0, context->cmd))
			used = true;
	}
	else if (context->subtype & ENCH_TODAM) {
		if (enchant_spell(0, value, 0, context->cmd))
			used = true;
	}
	if (context->subtype & ENCH_TOAC) {
		if (enchant_spell(0, 0, value, context->cmd))
			used = true;
	}

	return used;
}